

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O1

void __thiscall FDecalTemplate::ApplyToDecal(FDecalTemplate *this,DBaseDecal *decal,side_t *wall)

{
  ushort uVar1;
  FDecalAnimator *pFVar2;
  uint uVar3;
  
  if (((this->RenderStyle).field_0.Flags & 8) != 0) {
    DBaseDecal::SetShade(decal,this->ShadeColor);
  }
  decal->Translation = this->Translation;
  decal->ScaleX = this->ScaleX;
  decal->ScaleY = this->ScaleY;
  (decal->PicNum).texnum = (this->PicNum).texnum;
  decal->Alpha = this->Alpha;
  decal->RenderStyle = this->RenderStyle;
  uVar1 = this->RenderFlags;
  decal->RenderFlags = decal->RenderFlags & 0x8f04 | uVar1 & 0xfcff;
  if ((uVar1 & 0x300) != 0) {
    uVar3 = FRandom::GenRand32(&pr_decal);
    decal->RenderFlags = decal->RenderFlags ^ *(byte *)((long)&this->RenderFlags + 1) & uVar3 & 3;
  }
  pFVar2 = this->Animator;
  if (pFVar2 != (FDecalAnimator *)0x0) {
    (*pFVar2->_vptr_FDecalAnimator[2])(pFVar2,decal,wall);
    return;
  }
  return;
}

Assistant:

void FDecalTemplate::ApplyToDecal (DBaseDecal *decal, side_t *wall) const
{
	if (RenderStyle.Flags & STYLEF_ColorIsFixed)
	{
		decal->SetShade (ShadeColor);
	}
	decal->Translation = Translation;
	decal->ScaleX = ScaleX;
	decal->ScaleY = ScaleY;
	decal->PicNum = PicNum;
	decal->Alpha = Alpha;
	decal->RenderStyle = RenderStyle;
	decal->RenderFlags = (RenderFlags & ~(DECAL_RandomFlipX|DECAL_RandomFlipY)) |
		(decal->RenderFlags & (RF_RELMASK|RF_CLIPMASK|RF_INVISIBLE|RF_ONESIDED));
	if (RenderFlags & (DECAL_RandomFlipX|DECAL_RandomFlipY))
	{
		decal->RenderFlags ^= pr_decal() &
			((RenderFlags & (DECAL_RandomFlipX|DECAL_RandomFlipY)) >> 8);
	}
	if (Animator != NULL)
	{
		Animator->CreateThinker (decal, wall);
	}
}